

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

int64_t yactfr::internal::anon_unknown_0::readFlSIntLe5At5(uint8_t *buf)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (buf[1] & 3) << 3;
  uVar3 = (ulong)(*buf >> 5 | uVar2);
  uVar1 = uVar3 - 0x20;
  if (uVar2 < 0x10) {
    uVar1 = uVar3;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntLe5At5(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[1];
    res <<= 3;
    res |= (buf[0] >> 5);
    res &= UINT64_C(0x1f);

    if (res >> 4) {
        res |= UINT64_C(0xffffffffffffffe0);
    }

    return static_cast<std::int64_t>(res);
}